

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

void idct16_low1_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  uint uVar12;
  int iVar13;
  int32_t *piVar14;
  int in_ECX;
  uint in_EDX;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  uint in_R9D;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  __m256i offset;
  int log_range_out;
  __m256i clamp_hi;
  __m256i clamp_lo;
  int log_range;
  __m256i rnding;
  __m256i cospi32;
  int32_t *cospi;
  char local_538;
  char local_52c;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  byte local_420;
  char local_414;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  piVar14 = cospi_arr(in_EDX);
  uVar12 = piVar14[0x20];
  auVar1 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
  auVar1 = vpinsrd_avx(auVar1,uVar12,2);
  auVar1 = vpinsrd_avx(auVar1,uVar12,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
  auVar2 = vpinsrd_avx(auVar2,uVar12,2);
  auVar2 = vpinsrd_avx(auVar2,uVar12,3);
  uStack_1f0 = auVar2._0_8_;
  uStack_1e8 = auVar2._8_8_;
  local_414 = (char)in_EDX;
  uVar12 = 1 << (local_414 - 1U & 0x1f);
  auVar2 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
  auVar2 = vpinsrd_avx(auVar2,uVar12,2);
  auVar2 = vpinsrd_avx(auVar2,uVar12,3);
  auVar3 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
  auVar3 = vpinsrd_avx(auVar3,uVar12,2);
  auVar3 = vpinsrd_avx(auVar3,uVar12,3);
  auVar16 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
  uStack_1b0 = auVar16._0_8_;
  uStack_1a8 = auVar16._8_8_;
  iVar13 = 8;
  if (in_ECX != 0) {
    iVar13 = 6;
  }
  if (in_R8D + iVar13 < 0x10) {
    local_52c = '\x10';
  }
  else {
    local_52c = '\b';
    if (in_ECX != 0) {
      local_52c = '\x06';
    }
    local_52c = (char)in_R8D + local_52c;
  }
  uVar12 = -(1 << (local_52c - 1U & 0x1f));
  auVar16 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
  auVar16 = vpinsrd_avx(auVar16,uVar12,2);
  auVar16 = vpinsrd_avx(auVar16,uVar12,3);
  auVar15 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
  auVar15 = vpinsrd_avx(auVar15,uVar12,2);
  auVar15 = vpinsrd_avx(auVar15,uVar12,3);
  local_180 = auVar16._0_8_;
  uStack_178 = auVar16._8_8_;
  uStack_170 = auVar15._0_8_;
  uStack_168 = auVar15._8_8_;
  local_4c0 = local_180;
  uStack_4b8 = uStack_178;
  uStack_4b0 = uStack_170;
  uStack_4a8 = uStack_168;
  uVar12 = (1 << (local_52c - 1U & 0x1f)) - 1;
  auVar16 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
  auVar16 = vpinsrd_avx(auVar16,uVar12,2);
  auVar16 = vpinsrd_avx(auVar16,uVar12,3);
  auVar15 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
  auVar15 = vpinsrd_avx(auVar15,uVar12,2);
  auVar15 = vpinsrd_avx(auVar15,uVar12,3);
  auVar15 = ZEXT116(0) * auVar16 + ZEXT116(1) * auVar15;
  auVar16 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar16;
  auVar4._16_8_ = uStack_1f0;
  auVar4._0_16_ = auVar1;
  auVar4._24_8_ = uStack_1e8;
  auVar4 = vpmulld_avx2(*in_RDI,auVar4);
  *in_RDI = auVar4;
  auVar9._16_8_ = uStack_1b0;
  auVar9._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
  auVar9._24_8_ = uStack_1a8;
  auVar4 = vpaddd_avx2(*in_RDI,auVar9);
  *in_RDI = auVar4;
  auVar4 = vpsrad_avx2(*in_RDI,ZEXT416(in_EDX));
  *in_RDI = auVar4;
  if (in_ECX == 0) {
    if (in_R8D + 6 < 0x10) {
      local_538 = '\x10';
    }
    else {
      local_538 = (char)in_R8D + '\x06';
    }
    uVar12 = -(1 << (local_538 - 1U & 0x1f));
    auVar1 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
    auVar1 = vpinsrd_avx(auVar1,uVar12,2);
    auVar1 = vpinsrd_avx(auVar1,uVar12,3);
    auVar2 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
    auVar2 = vpinsrd_avx(auVar2,uVar12,2);
    auVar2 = vpinsrd_avx(auVar2,uVar12,3);
    local_100 = auVar1._0_8_;
    uStack_f8 = auVar1._8_8_;
    uStack_f0 = auVar2._0_8_;
    uStack_e8 = auVar2._8_8_;
    local_4c0 = local_100;
    uStack_4b8 = uStack_f8;
    uStack_4b0 = uStack_f0;
    uStack_4a8 = uStack_e8;
    uVar12 = (1 << (local_538 - 1U & 0x1f)) - 1;
    auVar1 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
    auVar1 = vpinsrd_avx(auVar1,uVar12,2);
    auVar15 = vpinsrd_avx(auVar1,uVar12,3);
    auVar1 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
    auVar1 = vpinsrd_avx(auVar1,uVar12,2);
    auVar16 = vpinsrd_avx(auVar1,uVar12,3);
    local_420 = (byte)in_R9D;
    uVar12 = (1 << (local_420 & 0x1f)) >> 1;
    auVar1 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
    auVar1 = vpinsrd_avx(auVar1,uVar12,2);
    auVar1 = vpinsrd_avx(auVar1,uVar12,3);
    auVar2 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
    auVar2 = vpinsrd_avx(auVar2,uVar12,2);
    auVar2 = vpinsrd_avx(auVar2,uVar12,3);
    uStack_70 = auVar2._0_8_;
    uStack_68 = auVar2._8_8_;
    auVar8._16_8_ = uStack_70;
    auVar8._0_16_ = auVar1;
    auVar8._24_8_ = uStack_68;
    auVar4 = vpaddd_avx2(*in_RDI,auVar8);
    *in_RDI = auVar4;
    auVar4 = vpsrad_avx2(*in_RDI,ZEXT416(in_R9D));
    *in_RDI = auVar4;
  }
  uStack_4c8 = auVar16._8_8_;
  uStack_4d0 = auVar16._0_8_;
  auVar10._8_8_ = uStack_4b8;
  auVar10._0_8_ = local_4c0;
  auVar10._16_8_ = uStack_4b0;
  auVar10._24_8_ = uStack_4a8;
  auVar4 = vpmaxsd_avx2(*in_RDI,auVar10);
  *in_RDI = auVar4;
  auVar11._16_8_ = uStack_4d0;
  auVar11._0_16_ = auVar15;
  auVar11._24_8_ = uStack_4c8;
  auVar4 = vpminsd_avx2(*in_RDI,auVar11);
  *in_RDI = auVar4;
  uVar5 = *(undefined8 *)(*in_RDI + 8);
  uVar6 = *(undefined8 *)(*in_RDI + 0x10);
  uVar7 = *(undefined8 *)(*in_RDI + 0x18);
  *in_RSI = *(undefined8 *)*in_RDI;
  in_RSI[1] = uVar5;
  in_RSI[2] = uVar6;
  in_RSI[3] = uVar7;
  uVar5 = *(undefined8 *)(*in_RDI + 8);
  uVar6 = *(undefined8 *)(*in_RDI + 0x10);
  uVar7 = *(undefined8 *)(*in_RDI + 0x18);
  in_RSI[4] = *(undefined8 *)*in_RDI;
  in_RSI[5] = uVar5;
  in_RSI[6] = uVar6;
  in_RSI[7] = uVar7;
  uVar5 = *(undefined8 *)(*in_RDI + 8);
  uVar6 = *(undefined8 *)(*in_RDI + 0x10);
  uVar7 = *(undefined8 *)(*in_RDI + 0x18);
  in_RSI[8] = *(undefined8 *)*in_RDI;
  in_RSI[9] = uVar5;
  in_RSI[10] = uVar6;
  in_RSI[0xb] = uVar7;
  uVar5 = *(undefined8 *)(*in_RDI + 8);
  uVar6 = *(undefined8 *)(*in_RDI + 0x10);
  uVar7 = *(undefined8 *)(*in_RDI + 0x18);
  in_RSI[0xc] = *(undefined8 *)*in_RDI;
  in_RSI[0xd] = uVar5;
  in_RSI[0xe] = uVar6;
  in_RSI[0xf] = uVar7;
  uVar5 = *(undefined8 *)(*in_RDI + 8);
  uVar6 = *(undefined8 *)(*in_RDI + 0x10);
  uVar7 = *(undefined8 *)(*in_RDI + 0x18);
  in_RSI[0x10] = *(undefined8 *)*in_RDI;
  in_RSI[0x11] = uVar5;
  in_RSI[0x12] = uVar6;
  in_RSI[0x13] = uVar7;
  uVar5 = *(undefined8 *)(*in_RDI + 8);
  uVar6 = *(undefined8 *)(*in_RDI + 0x10);
  uVar7 = *(undefined8 *)(*in_RDI + 0x18);
  in_RSI[0x14] = *(undefined8 *)*in_RDI;
  in_RSI[0x15] = uVar5;
  in_RSI[0x16] = uVar6;
  in_RSI[0x17] = uVar7;
  uVar5 = *(undefined8 *)(*in_RDI + 8);
  uVar6 = *(undefined8 *)(*in_RDI + 0x10);
  uVar7 = *(undefined8 *)(*in_RDI + 0x18);
  in_RSI[0x18] = *(undefined8 *)*in_RDI;
  in_RSI[0x19] = uVar5;
  in_RSI[0x1a] = uVar6;
  in_RSI[0x1b] = uVar7;
  uVar5 = *(undefined8 *)(*in_RDI + 8);
  uVar6 = *(undefined8 *)(*in_RDI + 0x10);
  uVar7 = *(undefined8 *)(*in_RDI + 0x18);
  in_RSI[0x1c] = *(undefined8 *)*in_RDI;
  in_RSI[0x1d] = uVar5;
  in_RSI[0x1e] = uVar6;
  in_RSI[0x1f] = uVar7;
  uVar5 = *(undefined8 *)(*in_RDI + 8);
  uVar6 = *(undefined8 *)(*in_RDI + 0x10);
  uVar7 = *(undefined8 *)(*in_RDI + 0x18);
  in_RSI[0x20] = *(undefined8 *)*in_RDI;
  in_RSI[0x21] = uVar5;
  in_RSI[0x22] = uVar6;
  in_RSI[0x23] = uVar7;
  uVar5 = *(undefined8 *)(*in_RDI + 8);
  uVar6 = *(undefined8 *)(*in_RDI + 0x10);
  uVar7 = *(undefined8 *)(*in_RDI + 0x18);
  in_RSI[0x24] = *(undefined8 *)*in_RDI;
  in_RSI[0x25] = uVar5;
  in_RSI[0x26] = uVar6;
  in_RSI[0x27] = uVar7;
  uVar5 = *(undefined8 *)(*in_RDI + 8);
  uVar6 = *(undefined8 *)(*in_RDI + 0x10);
  uVar7 = *(undefined8 *)(*in_RDI + 0x18);
  in_RSI[0x28] = *(undefined8 *)*in_RDI;
  in_RSI[0x29] = uVar5;
  in_RSI[0x2a] = uVar6;
  in_RSI[0x2b] = uVar7;
  uVar5 = *(undefined8 *)(*in_RDI + 8);
  uVar6 = *(undefined8 *)(*in_RDI + 0x10);
  uVar7 = *(undefined8 *)(*in_RDI + 0x18);
  in_RSI[0x2c] = *(undefined8 *)*in_RDI;
  in_RSI[0x2d] = uVar5;
  in_RSI[0x2e] = uVar6;
  in_RSI[0x2f] = uVar7;
  uVar5 = *(undefined8 *)(*in_RDI + 8);
  uVar6 = *(undefined8 *)(*in_RDI + 0x10);
  uVar7 = *(undefined8 *)(*in_RDI + 0x18);
  in_RSI[0x30] = *(undefined8 *)*in_RDI;
  in_RSI[0x31] = uVar5;
  in_RSI[0x32] = uVar6;
  in_RSI[0x33] = uVar7;
  uVar5 = *(undefined8 *)(*in_RDI + 8);
  uVar6 = *(undefined8 *)(*in_RDI + 0x10);
  uVar7 = *(undefined8 *)(*in_RDI + 0x18);
  in_RSI[0x34] = *(undefined8 *)*in_RDI;
  in_RSI[0x35] = uVar5;
  in_RSI[0x36] = uVar6;
  in_RSI[0x37] = uVar7;
  uVar5 = *(undefined8 *)(*in_RDI + 8);
  uVar6 = *(undefined8 *)(*in_RDI + 0x10);
  uVar7 = *(undefined8 *)(*in_RDI + 0x18);
  in_RSI[0x38] = *(undefined8 *)*in_RDI;
  in_RSI[0x39] = uVar5;
  in_RSI[0x3a] = uVar6;
  in_RSI[0x3b] = uVar7;
  uVar5 = *(undefined8 *)(*in_RDI + 8);
  uVar6 = *(undefined8 *)(*in_RDI + 0x10);
  uVar7 = *(undefined8 *)(*in_RDI + 0x18);
  in_RSI[0x3c] = *(undefined8 *)*in_RDI;
  in_RSI[0x3d] = uVar5;
  in_RSI[0x3e] = uVar6;
  in_RSI[0x3f] = uVar7;
  return;
}

Assistant:

static void idct16_low1_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                             int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  __m256i clamp_lo = _mm256_set1_epi32(-(1 << (log_range - 1)));
  __m256i clamp_hi = _mm256_set1_epi32((1 << (log_range - 1)) - 1);

  {
    // stage 0
    // stage 1
    // stage 2
    // stage 3
    // stage 4
    in[0] = _mm256_mullo_epi32(in[0], cospi32);
    in[0] = _mm256_add_epi32(in[0], rnding);
    in[0] = _mm256_srai_epi32(in[0], bit);

    // stage 5
    // stage 6
    // stage 7
    if (!do_cols) {
      const int log_range_out = AOMMAX(16, bd + 6);
      clamp_lo = _mm256_set1_epi32(-(1 << (log_range_out - 1)));
      clamp_hi = _mm256_set1_epi32((1 << (log_range_out - 1)) - 1);
      __m256i offset = _mm256_set1_epi32((1 << out_shift) >> 1);
      in[0] = _mm256_add_epi32(in[0], offset);
      in[0] = _mm256_sra_epi32(in[0], _mm_cvtsi32_si128(out_shift));
    }
    in[0] = _mm256_max_epi32(in[0], clamp_lo);
    in[0] = _mm256_min_epi32(in[0], clamp_hi);
    out[0] = in[0];
    out[1] = in[0];
    out[2] = in[0];
    out[3] = in[0];
    out[4] = in[0];
    out[5] = in[0];
    out[6] = in[0];
    out[7] = in[0];
    out[8] = in[0];
    out[9] = in[0];
    out[10] = in[0];
    out[11] = in[0];
    out[12] = in[0];
    out[13] = in[0];
    out[14] = in[0];
    out[15] = in[0];
  }
}